

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uint lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  uint ret;
  char local_23;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_21;
  uint local_20 [2];
  
  result_00 = &local_22;
  local_22.m_int = '\0';
  local_20[0] = lhs;
  bVar1 = DivisionCornerCaseHelper<signed_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(lhs,rhs,result_00);
  if (!bVar1) {
    local_20[1] = 0;
    local_23 = rhs.m_int;
    DivisionHelper<unsigned_int,_signed_char,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (local_20,&local_23,local_20 + 1);
    result_00 = &local_21;
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<unsigned_int>(result_00,local_20 + 1);
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}